

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_expr_op * jx9ExprExtractOperator(SyString *pStr,SyToken *pLast)

{
  int local_34;
  jx9_expr_op *pOp;
  sxi32 rc;
  sxu32 n;
  SyToken *pLast_local;
  SyString *pStr_local;
  
  pOp._4_4_ = 0;
  do {
    if (0x31 < pOp._4_4_) {
      return (jx9_expr_op *)0x0;
    }
    if (pStr->nByte == aOpTable[pOp._4_4_].sOp.nByte) {
      local_34 = SyMemcmp(pStr->zString,aOpTable[pOp._4_4_].sOp.zString,
                          aOpTable[pOp._4_4_].sOp.nByte);
    }
    else {
      local_34 = pStr->nByte - aOpTable[pOp._4_4_].sOp.nByte;
    }
    if (local_34 == 0) {
      if ((aOpTable[pOp._4_4_].sOp.nByte != 1) ||
         (((aOpTable[pOp._4_4_].iOp != 7 && (aOpTable[pOp._4_4_].iOp != 8)) ||
          (pLast == (SyToken *)0x0)))) {
        if ((aOpTable[pOp._4_4_].iOp == 2) &&
           ((pLast == (SyToken *)0x0 || ((pLast->nType & 0x1408) == 0)))) {
          return (jx9_expr_op *)0x0;
        }
        return aOpTable + pOp._4_4_;
      }
      if ((pLast->nType & 0x120a40) != 0) {
        return aOpTable + pOp._4_4_;
      }
      if ((((pLast->nType & 0x20) != 0) && (*(int *)((long)pLast->pUserData + 0x10) != 4)) &&
         (*(int *)((long)pLast->pUserData + 0x10) != 5)) {
        return aOpTable + pOp._4_4_;
      }
    }
    pOp._4_4_ = pOp._4_4_ + 1;
  } while( true );
}

Assistant:

JX9_PRIVATE const jx9_expr_op *  jx9ExprExtractOperator(SyString *pStr, SyToken *pLast)
{
	sxu32 n = 0;
	sxi32 rc;
	/* Do a linear lookup on the operators table */
	for(;;){
		if( n >= SX_ARRAYSIZE(aOpTable) ){
			break;
		}
		rc = SyStringCmp(pStr, &aOpTable[n].sOp, SyMemcmp);		
		if( rc == 0 ){
			if( aOpTable[n].sOp.nByte != sizeof(char) || (aOpTable[n].iOp != EXPR_OP_UMINUS && aOpTable[n].iOp != EXPR_OP_UPLUS) || pLast == 0 ){
				if( aOpTable[n].iOp == EXPR_OP_SUBSCRIPT && (pLast == 0 || (pLast->nType & (JX9_TK_ID|JX9_TK_CSB/*]*/|JX9_TK_RPAREN/*)*/)) == 0) ){
					/* JSON Array not subscripting, return NULL  */
					return 0;
				}
				/* There is no ambiguity here, simply return the first operator seen */
				return &aOpTable[n];
			}
			/* Handle ambiguity */
			if( pLast->nType & (JX9_TK_LPAREN/*'('*/|JX9_TK_OCB/*'{'*/|JX9_TK_OSB/*'['*/|JX9_TK_COLON/*:*/|JX9_TK_COMMA/*, '*/) ){
				/* Unary opertors have prcedence here over binary operators */
				return &aOpTable[n];
			}
			if( pLast->nType & JX9_TK_OP ){
				const jx9_expr_op *pOp = (const jx9_expr_op *)pLast->pUserData;
				/* Ticket 1433-31: Handle the '++', '--' operators case */
				if( pOp->iOp != EXPR_OP_INCR && pOp->iOp != EXPR_OP_DECR ){
					/* Unary opertors have prcedence here over binary operators */
					return &aOpTable[n];
				}
			
			}
		}
		++n; /* Next operator in the table */
	}
	/* No such operator */
	return 0;
}